

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O1

void __thiscall merlin::wmb::match_clusters(wmb *this,size_t x,double step)

{
  double dVar1;
  unsigned_long uVar2;
  findex a;
  double dVar3;
  pointer pdVar4;
  pointer pmVar5;
  size_t sVar6;
  pointer puVar7;
  findex *pfVar8;
  long lVar9;
  size_type __n;
  long lVar10;
  ulong uVar11;
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  variable VX;
  variable_set var;
  factor fmatch;
  factor bel;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_1b8;
  double local_1a0;
  variable local_198;
  variable_set local_188;
  factor local_150;
  factor local_f0;
  factor local_90;
  
  pmVar5 = (this->m_clusters).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)*(pointer *)
                         ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                         8) -
                 *(long *)&pmVar5[x].super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)) {
    dVar1 = (this->super_graphical_model).m_dims.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[x];
    local_198.m_states = (size_t)dVar1;
    local_198.m_states =
         (long)(dVar1 - 9.223372036854776e+18) & (long)local_198.m_states >> 0x3f |
         local_198.m_states;
    sVar6 = x + 0x3f;
    if (-1 < (long)x) {
      sVar6 = x;
    }
    lVar9 = (long)*(pointer *)
                   ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
            *(long *)&pmVar5[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    __n = lVar9 >> 3;
    local_1a0 = step;
    local_198.m_label = x;
    if (((this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
         [((long)sVar6 >> 6) +
          (ulong)((x & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >> (x & 0x3f)
        & 1) == 0) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b8,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar5 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar8 = *(findex **)
                &pmVar5[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (pfVar8 != *(pointer *)
                     ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar9 = 0;
        do {
          a = *pfVar8;
          calc_belief(&local_f0,this,a);
          if (local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            dVar1 = (this->m_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[a];
            uVar11 = 0;
            do {
              pdVar4 = local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar3 = pow(local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11],1.0 / dVar1);
              pdVar4[uVar11] = dVar3;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)local_f0.t_.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_f0.t_.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          factor::marginal(&local_90,&local_f0,&local_188);
          factor::operator=(local_1b8.
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar9,&local_90);
          factor::~factor(&local_90);
          factor::binaryOp<merlin::factor::binOpPower>
                    (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[a],0),&local_90,
                     local_1b8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9);
          factor::binaryOpIP<merlin::factor::binOpTimes>(&local_150,&local_90);
          factor::~factor(&local_90);
          factor::~factor(&local_f0);
          pfVar8 = pfVar8 + 1;
          lVar9 = lVar9 + 1;
          pmVar5 = (this->m_clusters).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (pfVar8 != *(pointer *)
                            ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
      puVar7 = *(pointer *)
                &pmVar5[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (puVar7 != *(pointer *)
                     ((long)&(this->m_clusters).
                             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[x].
                             super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar9 = 0;
        do {
          uVar2 = *puVar7;
          factor::binaryOp<merlin::factor::binOpDivide>
                    (&local_90,&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar9);
          factor::binaryOp<merlin::factor::binOpPower>
                    (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar2] * local_1a0,0),&local_f0,
                     &local_90);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    ((this->m_reparam).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar2,&local_f0);
          factor::~factor(&local_f0);
          factor::~factor(&local_90);
          puVar7 = puVar7 + 1;
          lVar9 = lVar9 + 0x60;
        } while (puVar7 != *(pointer *)
                            ((long)&(this->m_clusters).
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[x].
                                    super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
    }
    else {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b8,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar5 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar8 = *(findex **)
                &pmVar5[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (pfVar8 != *(pointer *)
                     ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar10 = 0;
        do {
          calc_belief(&local_f0,this,*pfVar8);
          factor::maxmarginal(&local_90,&local_f0,&local_188);
          factor::operator=((factor *)
                            ((long)&(local_1b8.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor +
                            lVar10),&local_90);
          factor::~factor(&local_90);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    (&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar10);
          factor::~factor(&local_f0);
          pfVar8 = pfVar8 + 1;
          lVar10 = lVar10 + 0x60;
        } while (pfVar8 != *(pointer *)
                            ((long)&(this->m_clusters).
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[x].
                                    super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
      if (local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          pdVar4 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pow(local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11],
                      1.0 / (((double)CONCAT44(0x45300000,(int)(lVar9 >> 0x23)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)));
          pdVar4[uVar11] = dVar1;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_150.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_150.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      pmVar5 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(pointer *)
                &pmVar5[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (puVar7 != *(pointer *)
                     ((long)&pmVar5[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar9 = 0;
        do {
          uVar2 = *puVar7;
          factor::binaryOp<merlin::factor::binOpDivide>
                    (&local_f0,&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar9);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    ((this->m_reparam).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar2,&local_f0);
          factor::~factor(&local_f0);
          puVar7 = puVar7 + 1;
          lVar9 = lVar9 + 0x60;
        } while (puVar7 != *(pointer *)
                            ((long)&(this->m_clusters).
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[x].
                                    super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
    }
    factor::~factor(&local_150);
    variable_set::~variable_set(&local_188);
    std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_1b8);
  }
  return;
}

Assistant:

void wmb::match_clusters(size_t x, double step) {

	if (m_clusters[x].size() <= 1) {
		return; // no matching
	}

	variable VX = var(x);
	if (m_var_types[x] == true) { // max marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R); // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);

		size_t i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			ftmp[i] = bel.maxmarginal(var); // max-marginal
			fmatch *= ftmp[i];
		}

		i = 0;
		fmatch ^= (1.0/R); // and match each bucket to it
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= (fmatch/ftmp[i]);
		}

	} else { // weighted marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R);   // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);
		size_t i = 0;

		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			bel ^= (1.0/m_weights[a]);
			ftmp[i] = bel.marginal(var);
			fmatch *= (ftmp[i] ^ m_weights[a]);
		}

		i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= ((fmatch/ftmp[i])^(step*m_weights[a]));
		}
	}
}